

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void env_put(char *identifer,int line,Object value,Environment *env)

{
  Object value_00;
  Object o;
  undefined8 in_stack_ffffffffffffff88;
  int aiStack_68 [2];
  Object old;
  Record *get;
  Environment *env_local;
  int line_local;
  char *identifer_local;
  
  old.field_1.routine.code.statements = (Statement *)env_match(identifer,env);
  if ((Record *)old.field_1.routine.code.statements == (Record *)0x0) {
    rec_new(identifer,value,env);
  }
  else if ((((Record *)old.field_1.routine.code.statements)->object).type == OBJECT_ARRAY) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Array cannot be assigned directly!\x1b[0m",
           (ulong)(uint)line);
    stop();
  }
  else {
    memcpy(aiStack_68,&((Record *)old.field_1.routine.code.statements)->object,0x40);
    value_00.field_1.routine.code.statements = (Statement *)in_stack_ffffffffffffff88;
    value_00._0_56_ = value.field_1;
    incr_ref(value_00);
    memcpy(&(old.field_1.routine.code.statements)->field_1,&value,0x40);
    if (aiStack_68[0] == 5) {
      o.field_1.instance = old.field_1.instance;
      o.type = old.type;
      o._4_4_ = old._4_4_;
      o.field_1._8_8_ = old.field_1._8_8_;
      o.field_1._16_8_ = old.field_1._16_8_;
      o.field_1.routine.arguments = old.field_1.routine.arguments;
      o.field_1._32_8_ = old.field_1._32_8_;
      o.field_1.container.constructor.statements = old.field_1.container.constructor.statements;
      o.field_1.routine.code.statements = (Statement *)in_stack_ffffffffffffff88;
      gc_obj(o);
    }
  }
  return;
}

Assistant:

void env_put(char* identifer, int line, Object value, Environment *env){
    Record *get = env_match(identifer, env);
    if(get == NULL)
        rec_new(identifer, value, env);
    else if(get->object.type == OBJECT_ARRAY){
        printf(runtime_error("Array cannot be assigned directly!"), line);
        stop();
    }
    else{
        Object old = get->object;
        incr_ref(value);
        get->object = value;
        if(old.type == OBJECT_INSTANCE){
            gc_obj(old);
            //            printf(debug("[Put] Reassigning %s! Decremented refcount of %s#%d to %d!"),
            //                    identifer, get->object.instance->name, get->object.instance->insCount,
            //                    get->object.instance->refCount);
        }
    }
}